

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

int __thiscall Epanet::Project::writeReport(Project *this)

{
  FileError *this_00;
  ENerror *e;
  undefined1 local_38 [8];
  ReportWriter reportWriter;
  Project *this_local;
  
  if ((this->outputFileOpened & 1U) == 0) {
    this_00 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(this_00,9);
    __cxa_throw(this_00,&FileError::typeinfo,FileError::~FileError);
  }
  ReportWriter::ReportWriter((ReportWriter *)local_38,&this->rptFile,&this->network);
  std::__cxx11::string::string((string *)&e,(string *)&this->inpFileName);
  ReportWriter::writeReport((ReportWriter *)local_38,(string *)&e,&this->outputFile);
  std::__cxx11::string::~string((string *)&e);
  ReportWriter::~ReportWriter((ReportWriter *)local_38);
  return 0;
}

Assistant:

int Project::writeReport()
    {
        try
        {
            if ( !outputFileOpened )
            {
                throw FileError(FileError::NO_RESULTS_SAVED_TO_REPORT);
            }
            ReportWriter reportWriter(rptFile, &network);
            reportWriter.writeReport(inpFileName, &outputFile);
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }